

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::QuerySelector(Element *this,String *selectors)

{
  pointer *this_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  String local_168;
  undefined1 local_138 [8];
  StyleSheetNodeListRaw leaf_nodes;
  StyleSheetNode root_node;
  String *selectors_local;
  Element *this_local;
  
  this_00 = &leaf_nodes.
             super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  StyleSheetNode::StyleSheetNode((StyleSheetNode *)this_00);
  StyleSheetParser::ConstructNodes
            ((StyleSheetNodeListRaw *)local_138,(StyleSheetNode *)this_00,selectors);
  bVar1 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::empty
                    ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                     local_138);
  if (bVar1) {
    uVar2 = ::std::__cxx11::string::c_str();
    GetAddress_abi_cxx11_(&local_168,this,false,true);
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_168);
    this_local = (Element *)0x0;
  }
  else {
    this_local = QuerySelectorMatchRecursive((StyleSheetNodeListRaw *)local_138,this,this);
  }
  ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~vector
            ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)local_138);
  StyleSheetNode::~StyleSheetNode
            ((StyleSheetNode *)
             &leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local;
}

Assistant:

Element* Element::QuerySelector(const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	return QuerySelectorMatchRecursive(leaf_nodes, this, this);
}